

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O2

void InitUndistortRectifyMap(Mat *K,Mat *D,Mat *xi,Mat *R,Mat *P,Size *size,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  int r;
  long lVar16;
  int c;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Size local_480;
  Size local_478;
  Mat KRi;
  Mat local_410 [16];
  long local_400;
  long *local_3c8;
  Mat local_3b0 [16];
  long local_3a0;
  long *local_368;
  Mat local_350 [352];
  Mat local_1f0 [16];
  double *local_1e0;
  Mat local_190 [352];
  
  local_478 = *size;
  cv::Mat::Mat(local_350,&local_478,5);
  cv::Mat::operator=(map1,local_350);
  cv::Mat::~Mat(local_350);
  local_480 = *size;
  cv::Mat::Mat(local_350,&local_480,5);
  cv::Mat::operator=(map2,local_350);
  cv::Mat::~Mat(local_350);
  pdVar12 = *(double **)(K + 0x10);
  dVar1 = *pdVar12;
  dVar2 = pdVar12[1];
  dVar3 = *(double *)((long)pdVar12 + **(long **)(K + 0x48) + 8);
  dVar4 = *(double *)((long)pdVar12 + **(long **)(K + 0x48) + 0x10);
  dVar5 = pdVar12[2];
  dVar6 = **(double **)(xi + 0x10);
  pdVar12 = *(double **)(D + 0x10);
  dVar7 = *pdVar12;
  dVar8 = pdVar12[1];
  dVar9 = pdVar12[2];
  dVar10 = pdVar12[3];
  cv::operator*(local_190,P);
  cv::MatExpr::inv((int)local_350);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&KRi);
  cv::MatExpr::~MatExpr((MatExpr *)local_350);
  cv::MatExpr::~MatExpr((MatExpr *)local_190);
  for (lVar16 = 0; lVar16 < size->height; lVar16 = lVar16 + 1) {
    dVar14 = (double)(int)lVar16;
    for (lVar17 = 0; lVar17 < size->width; lVar17 = lVar17 + 1) {
      cv::Mat::Mat(local_1f0,&KRi);
      dVar21 = (double)(int)lVar17;
      dVar18 = *local_1e0 * dVar21 + local_1e0[1] * dVar14 + local_1e0[2];
      cv::Mat::~Mat(local_1f0);
      cv::Mat::Mat(local_3b0,&KRi);
      lVar13 = *local_368;
      dVar11 = *(double *)(local_3a0 + lVar13);
      dVar19 = *(double *)(local_3a0 + 8 + lVar13);
      dVar20 = *(double *)(local_3a0 + 0x10 + lVar13);
      cv::Mat::~Mat(local_3b0);
      cv::Mat::Mat(local_410,&KRi);
      dVar20 = dVar20 + dVar11 * dVar21 + dVar19 * dVar14;
      lVar13 = *local_3c8;
      dVar19 = dVar21 * *(double *)(local_400 + lVar13 * 2) +
               *(double *)(local_400 + 8 + lVar13 * 2) * dVar14 +
               *(double *)(local_400 + 0x10 + lVar13 * 2);
      cv::Mat::~Mat(local_410);
      auVar22._8_8_ = dVar18;
      auVar22._0_8_ = dVar20;
      dVar11 = SQRT(dVar19 * dVar19 + dVar18 * dVar18 + dVar20 * dVar20);
      dVar19 = dVar19 / dVar11 + dVar6;
      auVar23._8_8_ = dVar11;
      auVar23._0_8_ = dVar11;
      auVar23 = divpd(auVar22,auVar23);
      auVar15._8_8_ = dVar19;
      auVar15._0_8_ = dVar19;
      auVar23 = divpd(auVar23,auVar15);
      dVar21 = auVar23._0_8_;
      dVar18 = auVar23._8_8_;
      dVar19 = dVar18 * dVar18 + dVar21 * dVar21;
      dVar11 = dVar7 * dVar19 + 1.0 + dVar19 * dVar19 * dVar8;
      dVar20 = ((dVar21 + dVar21) * dVar21 + dVar19) * dVar9 +
               dVar11 * dVar21 + dVar18 * (dVar10 + dVar10) * dVar21;
      *(float *)(**(long **)(map1 + 0x48) * lVar16 + *(long *)(map1 + 0x10) + lVar17 * 4) =
           (float)(dVar2 * dVar20 +
                   (((dVar18 + dVar18) * dVar18 + dVar19) * dVar10 +
                   dVar11 * dVar18 + (dVar9 + dVar9) * dVar18 * dVar21) * dVar1 + dVar5);
      *(float *)(**(long **)(map2 + 0x48) * lVar16 + *(long *)(map2 + 0x10) + lVar17 * 4) =
           (float)(dVar20 * dVar3 + dVar4);
    }
  }
  cv::Mat::~Mat(&KRi);
  return;
}

Assistant:

void InitUndistortRectifyMap(cv::Mat K, cv::Mat D, cv::Mat xi, cv::Mat R,
                             cv::Mat P, cv::Size size,
                             cv::Mat& map1, cv::Mat& map2) {
  map1 = cv::Mat(size, CV_32F);
  map2 = cv::Mat(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double xid = xi.at<double>(0,0);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat KRi = (P * R).inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = MatRowMul(KRi, c, r, 1., 0);
      double yc = MatRowMul(KRi, c, r, 1., 1);
      double zc = MatRowMul(KRi, c, r, 1., 2);

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xid);
      double yu = ys / (zs + xid);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}